

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O2

void Supp_ManRecycle(Supp_Man_t *p,char *pMemory,int nSize)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  void *pvVar4;
  int i;
  
  iVar3 = nSize / p->nStepSize;
  uVar2 = (long)nSize % (long)p->nStepSize;
  bVar1 = 0 < (int)uVar2;
  i = iVar3 + (uint)bVar1;
  Vec_PtrFillExtra(p->vFree,iVar3 + (uint)bVar1 + 1,(void *)(uVar2 & 0xffffffff));
  pvVar4 = Vec_PtrEntry(p->vFree,i);
  *(void **)pMemory = pvVar4;
  Vec_PtrWriteEntry(p->vFree,i,pMemory);
  return;
}

Assistant:

void Supp_ManRecycle( Supp_Man_t * p, char * pMemory, int nSize )
{
    int Type;
    Type = Supp_SizeType( nSize, p->nStepSize );
    Vec_PtrFillExtra( p->vFree, Type + 1, NULL );
    Supp_OneSetNext( pMemory, (char *)Vec_PtrEntry(p->vFree, Type) );
    Vec_PtrWriteEntry( p->vFree, Type, pMemory );
}